

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::MergeChars(FString *this,char *charset,char newchar)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  size_t mylen;
  size_t write;
  size_t read;
  char newchar_local;
  char *charset_local;
  FString *this_local;
  
  LockBuffer(this);
  mylen = 0;
  write = 0;
  sVar1 = Len(this);
  while (write < sVar1) {
    pcVar2 = strchr(charset,(int)this->Chars[write]);
    if (pcVar2 == (char *)0x0) {
      this->Chars[mylen] = this->Chars[write];
      write = write + 1;
    }
    else {
      do {
        sVar3 = write + 1;
        pcVar2 = strchr(charset,(int)this->Chars[write + 1]);
        write = sVar3;
      } while (pcVar2 != (char *)0x0);
      this->Chars[mylen] = newchar;
    }
    mylen = mylen + 1;
  }
  this->Chars[mylen] = '\0';
  ReallocBuffer(this,mylen);
  UnlockBuffer(this);
  return;
}

Assistant:

void FString::MergeChars (const char *charset, char newchar)
{
	size_t read, write, mylen;

	LockBuffer();
	for (read = write = 0, mylen = Len(); read < mylen; )
	{
		if (strchr (charset, Chars[read]) != NULL)
		{
			while (strchr (charset, Chars[++read]) != NULL)
			{
			}
			Chars[write++] = newchar;
		}
		else
		{
			Chars[write++] = Chars[read++];
		}
	}
	Chars[write] = '\0';
	ReallocBuffer (write);
	UnlockBuffer();
}